

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O2

void d68010_movec(void)

{
  long lVar1;
  uint uVar2;
  uint in_EDI;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  
  if (((byte)g_cpu_type & 0x1e) == 0) {
    if ((~g_cpu_ir & 0xf000) != 0) {
      d68000_illegal();
      return;
    }
    d68000_1111();
    return;
  }
  uVar2 = dasm_read_imm_16(in_EDI);
  uVar3 = uVar2 & 0xfff;
  pcVar5 = "1+";
  switch(uVar3) {
  case 0:
    pcVar4 = "SFC";
    break;
  case 1:
    pcVar4 = "DFC";
    break;
  case 2:
    pcVar5 = "2+";
    pcVar4 = "CACR";
    break;
  case 3:
    pcVar5 = "4+";
    pcVar4 = "TC";
    break;
  case 4:
    pcVar5 = "4+";
    pcVar4 = "ITT0";
    break;
  case 5:
    pcVar5 = "4+";
    pcVar4 = "ITT1";
    break;
  case 6:
    pcVar5 = "4+";
    pcVar4 = "DTT0";
    break;
  case 7:
    pcVar5 = "4+";
    pcVar4 = "DTT1";
    break;
  default:
    switch(uVar3) {
    case 0x800:
      pcVar4 = "USP";
      break;
    case 0x801:
      pcVar4 = "VBR";
      break;
    case 0x802:
      pcVar5 = "2,3";
      pcVar4 = "CAAR";
      break;
    case 0x803:
      pcVar5 = "2+";
      pcVar4 = "MSP";
      break;
    case 0x804:
      pcVar5 = "2+";
      pcVar4 = "ISP";
      break;
    case 0x805:
      pcVar5 = "4+";
      pcVar4 = "MMUSR";
      break;
    case 0x806:
      pcVar5 = "4+";
      pcVar4 = "URP";
      break;
    case 0x807:
      pcVar5 = "4+";
      pcVar4 = "SRP";
      break;
    default:
      make_signed_hex_str_16(uVar3);
      pcVar5 = "?";
      pcVar4 = make_signed_hex_str_16::str;
    }
  }
  uVar3 = uVar2 >> 0xc & 7;
  lVar1 = (ulong)(uVar2 < 0x8000) * 3 + 0x41;
  if ((g_cpu_ir & 1) != 0) {
    sprintf(g_dasm_str,"movec   %c%d, %s; (%s)",lVar1,(ulong)uVar3,pcVar4,pcVar5);
    return;
  }
  sprintf(g_dasm_str,"movec   %s, %c%d; (%s)",pcVar4,lVar1,(ulong)uVar3,pcVar5);
  return;
}

Assistant:

static void d68010_movec(void)
{
	uint extension;
	char* reg_name;
	char* processor;
	LIMIT_CPU_TYPES(M68010_PLUS);
	extension = read_imm_16();

	switch(extension & 0xfff)
	{
		case 0x000:
			reg_name = "SFC";
			processor = "1+";
			break;
		case 0x001:
			reg_name = "DFC";
			processor = "1+";
			break;
		case 0x800:
			reg_name = "USP";
			processor = "1+";
			break;
		case 0x801:
			reg_name = "VBR";
			processor = "1+";
			break;
		case 0x002:
			reg_name = "CACR";
			processor = "2+";
			break;
		case 0x802:
			reg_name = "CAAR";
			processor = "2,3";
			break;
		case 0x803:
			reg_name = "MSP";
			processor = "2+";
			break;
		case 0x804:
			reg_name = "ISP";
			processor = "2+";
			break;
		case 0x003:
			reg_name = "TC";
			processor = "4+";
			break;
		case 0x004:
			reg_name = "ITT0";
			processor = "4+";
			break;
		case 0x005:
			reg_name = "ITT1";
			processor = "4+";
			break;
		case 0x006:
			reg_name = "DTT0";
			processor = "4+";
			break;
		case 0x007:
			reg_name = "DTT1";
			processor = "4+";
			break;
		case 0x805:
			reg_name = "MMUSR";
			processor = "4+";
			break;
		case 0x806:
			reg_name = "URP";
			processor = "4+";
			break;
		case 0x807:
			reg_name = "SRP";
			processor = "4+";
			break;
		default:
			reg_name = make_signed_hex_str_16(extension & 0xfff);
			processor = "?";
	}

	if(BIT_0(g_cpu_ir))
		sprintf(g_dasm_str, "movec   %c%d, %s; (%s)", BIT_F(extension) ? 'A' : 'D', (extension>>12)&7, reg_name, processor);
	else
		sprintf(g_dasm_str, "movec   %s, %c%d; (%s)", reg_name, BIT_F(extension) ? 'A' : 'D', (extension>>12)&7, processor);
}